

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O2

void __thiscall
diligent_spirv_cross::SPIRConstant::SPIRConstant
          (SPIRConstant *this,TypeID constant_type_,SPIRConstant **vector_elements,
          uint32_t num_elements,bool specialized)

{
  SPIRConstant *pSVar1;
  Constant CVar2;
  Constant CVar3;
  Constant CVar4;
  Constant CVar5;
  undefined8 uVar6;
  ulong uVar7;
  ConstantMatrix *this_00;
  
  (this->super_IVariant).self.id = 0;
  (this->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRConstant_00ac2d68;
  *(uint32_t *)&(this->super_IVariant).field_0xc = constant_type_.id;
  this_00 = &this->m;
  ConstantMatrix::ConstantMatrix(this_00);
  this->specialization = specialized;
  this->is_used_as_array_length = false;
  this->is_used_as_lut = false;
  this->is_null_array_specialized_length = false;
  (this->subconstants).
  super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>_>.buffer_size = 0;
  (this->subconstants).
  super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>_>.ptr =
       (TypedID<(diligent_spirv_cross::Types)3> *)&(this->subconstants).stack_storage;
  (this->subconstants).buffer_capacity = 8;
  (this->specialization_constant_macro_name)._M_dataplus._M_p =
       (pointer)&(this->specialization_constant_macro_name).field_2;
  (this->specialization_constant_macro_name)._M_string_length = 0;
  (this->specialization_constant_macro_name).field_2._M_local_buf[0] = '\0';
  if (((*vector_elements)->m).c[0].vecsize < 2) {
    (this->m).c[0].vecsize = num_elements;
    (this->m).columns = 1;
    for (uVar7 = 0; num_elements != uVar7; uVar7 = uVar7 + 1) {
      (this->m).c[0].r[uVar7] = (vector_elements[uVar7]->m).c[0].r[0];
      if (vector_elements[uVar7]->specialization == true) {
        (this->m).c[0].id[uVar7].id = (vector_elements[uVar7]->super_IVariant).self.id;
      }
    }
  }
  else {
    (this->m).columns = num_elements;
    for (uVar7 = 0; num_elements != uVar7; uVar7 = uVar7 + 1) {
      pSVar1 = vector_elements[uVar7];
      this_00->c[0].vecsize = (pSVar1->m).c[0].vecsize;
      CVar2 = (pSVar1->m).c[0].r[0];
      CVar3 = (pSVar1->m).c[0].r[1];
      CVar4 = (pSVar1->m).c[0].r[2];
      CVar5 = (pSVar1->m).c[0].r[3];
      uVar6 = *(undefined8 *)((pSVar1->m).c[0].id + 2);
      *(undefined8 *)this_00->c[0].id = *(undefined8 *)(pSVar1->m).c[0].id;
      *(undefined8 *)(this_00->c[0].id + 2) = uVar6;
      this_00->c[0].r[2] = CVar4;
      this_00->c[0].r[3] = CVar5;
      this_00->c[0].r[0] = CVar2;
      this_00->c[0].r[1] = CVar3;
      if (vector_elements[uVar7]->specialization == true) {
        (this->m).id[uVar7].id = (vector_elements[uVar7]->super_IVariant).self.id;
      }
      this_00 = (ConstantMatrix *)(this_00->c + 1);
    }
  }
  return;
}

Assistant:

SPIRConstant(TypeID constant_type_, const SPIRConstant *const *vector_elements, uint32_t num_elements,
	             bool specialized)
	    : constant_type(constant_type_)
	    , specialization(specialized)
	{
		bool matrix = vector_elements[0]->m.c[0].vecsize > 1;

		if (matrix)
		{
			m.columns = num_elements;

			for (uint32_t i = 0; i < num_elements; i++)
			{
				m.c[i] = vector_elements[i]->m.c[0];
				if (vector_elements[i]->specialization)
					m.id[i] = vector_elements[i]->self;
			}
		}
		else
		{
			m.c[0].vecsize = num_elements;
			m.columns = 1;

			for (uint32_t i = 0; i < num_elements; i++)
			{
				m.c[0].r[i] = vector_elements[i]->m.c[0].r[0];
				if (vector_elements[i]->specialization)
					m.c[0].id[i] = vector_elements[i]->self;
			}
		}
	}